

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceMatrixDecomposition::~ForceMatrixDecomposition(ForceMatrixDecomposition *this)

{
  ForceDecomposition *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  in_RDI->_vptr_ForceDecomposition = (_func_int **)&PTR__ForceMatrixDecomposition_00500bb8;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  ForceDecomposition::~ForceDecomposition(in_RDI);
  return;
}

Assistant:

ForceMatrixDecomposition::~ForceMatrixDecomposition() {
#ifdef IS_MPI
    delete AtomPlanIntRow;
    delete AtomPlanRealRow;
    delete AtomPlanVectorRow;
    delete AtomPlanMatrixRow;
    delete AtomPlanPotRow;
    delete AtomPlanIntColumn;
    delete AtomPlanRealColumn;
    delete AtomPlanVectorColumn;
    delete AtomPlanMatrixColumn;
    delete AtomPlanPotColumn;
    delete cgPlanIntRow;
    delete cgPlanVectorRow;
    delete cgPlanIntColumn;
    delete cgPlanVectorColumn;
#endif
  }